

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_utils.cpp
# Opt level: O0

Graph * multi_agent_planning::generateGraph
                  (Graph *__return_storage_ptr__,int numV,int numConnected,float prob,int cost)

{
  edge_descriptor e;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  first;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  last;
  int iVar1;
  bool bVar2;
  edge_bundled *peVar3;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *g_;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *extraout_RDX;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *g__00;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>
  *extraout_RDX_00;
  value_type local_250;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  local_238;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  local_198;
  undefined1 local_108 [8];
  edge_iterator eIt;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  local_b8;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  local_70;
  undefined1 local_21;
  int local_20;
  float local_1c;
  int cost_local;
  float prob_local;
  int numConnected_local;
  int numV_local;
  Graph *graph;
  
  local_21 = 0;
  local_20 = cost;
  local_1c = prob;
  cost_local = numConnected;
  prob_local = (float)numV;
  _numConnected_local = __return_storage_ptr__;
  boost::
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  ::small_world_iterator
            (&local_70,
             (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)gen,(long)numV,(long)numConnected,(double)prob,false);
  boost::
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  ::small_world_iterator(&local_b8);
  first.n = local_70.n;
  first.gen = local_70.gen;
  first.k = local_70.k;
  first.prob = local_70.prob;
  first.source = local_70.source;
  first.target = local_70.target;
  first.allow_self_loops = local_70.allow_self_loops;
  first._49_7_ = local_70._49_7_;
  first.current.first = local_70.current.first;
  first.current.second = local_70.current.second;
  last.n = local_b8.n;
  last.gen = local_b8.gen;
  last.k = local_b8.k;
  last.prob = local_b8.prob;
  last.source = local_b8.source;
  last.target = local_b8.target;
  last.allow_self_loops = local_b8.allow_self_loops;
  last._49_7_ = local_b8._49_7_;
  last.current.first = local_b8.current.first;
  last.current.second = local_b8.current.second;
  boost::
  adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>
  ::
  adjacency_list<boost::small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>>>
            ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>
              *)__return_storage_ptr__,first,last,(long)(int)prob_local,0,
             (no_property *)((long)&eIt.m_g + 7));
  boost::
  edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>
            (&local_198,(boost *)__return_storage_ptr__,g_);
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  ::adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
              *)local_108,&local_198.first);
  std::
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  ::~pair(&local_198);
  g__00 = extraout_RDX;
  while( true ) {
    boost::
    edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>
              (&local_238,(boost *)__return_storage_ptr__,g__00);
    bVar2 = boost::detail::
            adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
            ::operator!=((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                          *)local_108,&local_238.second);
    std::
    pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
    ::~pair(&local_238);
    iVar1 = local_20;
    if (!bVar2) break;
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
    ::operator*(&local_250,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                 *)local_108);
    e.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         local_250.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    e.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
         local_250.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    e.m_eproperty = local_250.m_eproperty;
    peVar3 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
             ::operator[](__return_storage_ptr__,e);
    peVar3->cost = iVar1;
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
    ::operator++((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
                  *)local_108);
    g__00 = extraout_RDX_00;
  }
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  ::~adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
              *)local_108);
  return __return_storage_ptr__;
}

Assistant:

Graph generateGraph(int numV, int numConnected, float prob, int cost) {
	Graph graph = Graph(SWGen(gen, numV, numConnected, prob, false), SWGen(), numV);
	for (Graph::edge_iterator eIt = edges(graph).first; eIt != edges(graph).second; ++eIt) {
		graph[*eIt].cost = cost;
	}

	return graph;
}